

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQObject __thiscall SQFuncState::CreateString(SQFuncState *this,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  SQObject SVar2;
  SQObjectPtr ns;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._unVal.pString = SQString::Create(this->_sharedstate,s,len);
  local_20.super_SQObject._type = OT_STRING;
  local_20.super_SQObject._4_4_ = local_20.super_SQObject._4_4_ & 0xffffff00;
  pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._type = OT_INTEGER;
  local_30.super_SQObject._flags = '\0';
  local_30.super_SQObject._unVal.nInteger = 1;
  SQTable::NewSlot((this->_strings).super_SQObject._unVal.pTable,&local_20,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  SVar2._flags = local_20.super_SQObject._flags;
  SVar2._5_3_ = local_20.super_SQObject._5_3_;
  SVar2._type = local_20.super_SQObject._type;
  SVar2._unVal.pTable = local_20.super_SQObject._unVal.pTable;
  SQObjectPtr::~SQObjectPtr(&local_20);
  return SVar2;
}

Assistant:

SQObject SQFuncState::CreateString(const SQChar *s,SQInteger len)
{
    SQObjectPtr ns(SQString::Create(_sharedstate,s,len));
    _table(_strings)->NewSlot(ns,(SQInteger)1);
    return ns;
}